

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PragmaName * pragmaLocate(char *zName)

{
  int iVar1;
  PragmaName *local_28;
  int local_1c;
  int rc;
  int mid;
  int lwr;
  int upr;
  char *zName_local;
  
  local_1c = 0;
  rc = 0;
  mid = 0x41;
  while (rc <= mid) {
    local_1c = (rc + mid) / 2;
    iVar1 = sqlite3_stricmp(zName,aPragmaName[local_1c].zName);
    if (iVar1 == 0) break;
    if (iVar1 < 0) {
      mid = local_1c + -1;
    }
    else {
      rc = local_1c + 1;
    }
  }
  if (mid < rc) {
    local_28 = (PragmaName *)0x0;
  }
  else {
    local_28 = aPragmaName + local_1c;
  }
  return local_28;
}

Assistant:

static const PragmaName *pragmaLocate(const char *zName){
  int upr, lwr, mid = 0, rc;
  lwr = 0;
  upr = ArraySize(aPragmaName)-1;
  while( lwr<=upr ){
    mid = (lwr+upr)/2;
    rc = sqlite3_stricmp(zName, aPragmaName[mid].zName);
    if( rc==0 ) break;
    if( rc<0 ){
      upr = mid - 1;
    }else{
      lwr = mid + 1;
    }
  }
  return lwr>upr ? 0 : &aPragmaName[mid];
}